

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_QName(void)

{
  char cVar1;
  XSValue *pXVar2;
  long lVar3;
  bool bVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  Status myStatus;
  char iv_2 [4];
  char iv_3 [6];
  char v_3 [12];
  char iv_1 [14];
  char v_2 [15];
  char v_1 [16];
  Status local_9c;
  StrX local_98;
  char local_84 [4];
  undefined4 local_80;
  undefined2 local_7c;
  char local_78 [16];
  char local_68 [16];
  char local_58 [16];
  char local_48 [24];
  
  builtin_strncpy(local_48,"   Ant:Eater  \n",0x10);
  builtin_strncpy(local_58,"Minimum_Length",0xf);
  builtin_strncpy(local_78,"abcde:a2345",0xc);
  builtin_strncpy(local_68 + 8,"o:One",6);
  builtin_strncpy(local_68,"Three:Tw",8);
  builtin_strncpy(local_84,":my",4);
  local_7c = 0x65;
  local_80 = 0x6d616e2b;
  local_9c = st_Init;
  local_98.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_98.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar1 == '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1401,local_48,local_98.fLocalForm,1);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  local_9c = st_Init;
  local_98.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_98.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar1 == '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1402,local_58,local_98.fLocalForm,1);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  local_9c = st_Init;
  local_98.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_98.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar1 == '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1403,local_78,local_98.fLocalForm,1);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  local_9c = st_Init;
  local_98.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_98.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar1 != '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1406,local_68,local_98.fLocalForm,0);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  local_9c = st_Init;
  local_98.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_84,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_98.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_84,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar1 != '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1407,local_84,local_98.fLocalForm,0);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  local_9c = st_Init;
  local_98.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_98.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar1 != '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1408,&local_80,local_98.fLocalForm,0);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  bVar4 = true;
  do {
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    uVar8 = (uint)bVar4;
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_9c != st_NoActVal) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1422,local_48,local_98.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar5 = (void *)0x1422;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1422,local_48);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_9c != st_NoActVal) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1423,local_58,local_98.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar5 = (void *)0x1423;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1423,local_58);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_9c != st_NoActVal) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1424,local_78,local_98.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar5 = (void *)0x1424;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1424,local_78);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar2 == (XSValue *)0x0) {
      if (uVar8 * 3 + st_NoActVal != local_9c) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_NoActVal";
        if (bVar4 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1428,local_68,local_98.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar5 = (void *)0x1428;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1428,local_68);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_84,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_84,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar2 == (XSValue *)0x0) {
      if (uVar8 * 3 + st_NoActVal != local_9c) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_NoActVal";
        if (bVar4 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x142a,local_84,local_98.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar5 = (void *)0x142a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x142a,local_84);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar2 == (XSValue *)0x0) {
      if (uVar8 * 3 + st_NoActVal != local_9c) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_NoActVal";
        if (bVar4 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x142c,&local_80,local_98.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar5 = (void *)0x142c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x142c,&local_80);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    bVar9 = bVar4 != false;
    bVar4 = false;
  } while (bVar9);
  bVar4 = true;
  do {
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    uVar8 = (uint)bVar4;
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (lVar3 == 0) {
      if (local_9c != st_NoCanRep) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1449,local_48,local_98.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_98);
        goto LAB_0012ee77;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1449,local_48);
      StrX::~StrX(&local_98);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0012ee77:
      errSeen = 1;
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (lVar3 == 0) {
      if (local_9c != st_NoCanRep) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x144a,local_58,local_98.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_98);
        goto LAB_0012ef77;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x144a,local_58);
      StrX::~StrX(&local_98);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0012ef77:
      errSeen = 1;
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (lVar3 == 0) {
      if (local_9c != st_NoCanRep) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x144b,local_78,local_98.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_98);
        goto LAB_0012f077;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x144b,local_78);
      StrX::~StrX(&local_98);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0012f077:
      errSeen = 1;
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (lVar3 == 0) {
      if (uVar8 * 4 + st_NoCanRep != local_9c) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_NoCanRep";
        if (bVar4 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x144f,local_68,local_98.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_98);
        goto LAB_0012f18c;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x144f,local_68);
      StrX::~StrX(&local_98);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0012f18c:
      errSeen = 1;
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_84,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_84,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (lVar3 == 0) {
      if (uVar8 * 4 + st_NoCanRep != local_9c) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_NoCanRep";
        if (bVar4 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1451,local_84,local_98.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_98);
        goto LAB_0012f2a1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1451,local_84);
      StrX::~StrX(&local_98);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0012f2a1:
      errSeen = 1;
    }
    local_9c = st_Init;
    local_98.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_98.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_98.fUnicodeForm,dt_QName,&local_9c,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (lVar3 == 0) {
      if (uVar8 * 4 + st_NoCanRep != local_9c) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar6 = "st_NoCanRep";
        if (bVar4 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_9c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_9c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1453,&local_80,local_98.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_98);
        goto LAB_0012f3b6;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1453,&local_80);
      StrX::~StrX(&local_98);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0012f3b6:
      errSeen = 1;
    }
    bVar9 = bVar4 == false;
    bVar4 = false;
    if (bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_QName()
{
    const XSValue::DataType dt = XSValue::dt_QName;
    bool  toValidate = true;

    const char v_1[]="   Ant:Eater  \n";
    const char v_2[]="Minimum_Length";
    const char v_3[]="abcde:a2345";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    const char iv_1[]="Three:Two:One";
    const char iv_2[]=":my";
    const char iv_3[]="+name";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
    }

}